

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::openChannel(QProcessPrivate *this,Channel *channel)

{
  ProcessChannelType PVar1;
  long lVar2;
  QObject *parent;
  int iVar3;
  storage_type *psVar4;
  QSocketNotifier *this_00;
  Connection *this_01;
  sockaddr *__addr;
  char *pcVar5;
  int in_R8D;
  Channel *pCVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QUtf8StringView fnName;
  QUtf8StringView fnName_00;
  Connection CStack_78;
  Connection local_70;
  QArrayDataPointer<char16_t> local_68;
  Q_PIPE pipe [2];
  
  this_01 = &CStack_78;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  PVar1 = channel->type;
  if (PVar1 != Redirect) {
    if (PVar1 == PipeSource) {
      pCVar6 = &channel->process->stdinChannel;
    }
    else {
      if (PVar1 == Normal) {
        parent = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
        iVar3 = qt_create_pipe(channel->pipe);
        if (iVar3 == 0) {
          bVar7 = true;
          if ((((this->super_QIODevicePrivate).super_QObjectPrivate.threadData.
                super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p)->eventDispatcher).
              super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value._M_b._M_p !=
              (__pointer_type)0x0) {
            this_00 = (QSocketNotifier *)operator_new(0x10);
            if (&this->stdinChannel == channel) {
              QSocketNotifier::QSocketNotifier(this_00,Write,parent);
              channel->notifier = this_00;
              QSocketNotifier::setSocket(this_00,(long)channel->pipe[1]);
              __addr = (sockaddr *)channel->notifier;
              this_01 = &local_70;
            }
            else {
              QSocketNotifier::QSocketNotifier(this_00,Read,parent);
              channel->notifier = this_00;
              QSocketNotifier::setSocket(this_00,(long)channel->pipe[0]);
              __addr = (sockaddr *)channel->notifier;
            }
            QObject::connect((int)this_01,__addr,0x53a977);
            QMetaObject::Connection::~Connection(this_01);
          }
        }
        else {
          psVar4 = (storage_type *)
                   QBasicUtf8StringView<false>::lengthHelperContainer<char,5ul>
                             ((char (*) [5])0x51e1cf);
          fnName.m_size = -1;
          fnName.m_data = psVar4;
          anon_unknown.dwarf_133c8f4::errorMessageForSyscall
                    ((QString *)&local_68,(anon_unknown_dwarf_133c8f4 *)0x51e1cf,fnName,in_R8D);
          setErrorAndEmit(this,FailedToStart,(QString *)&local_68);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          bVar7 = false;
        }
        goto LAB_003d27d5;
      }
      pCVar6 = channel;
      channel = &channel->process->stdoutChannel;
    }
    bVar7 = true;
    if ((channel->pipe[1] == -1) && (pCVar6->pipe[0] == -1)) {
      pipe[0] = -1;
      pipe[1] = -1;
      iVar3 = qt_create_pipe(pipe);
      bVar7 = iVar3 == 0;
      if (bVar7) {
        pCVar6->pipe[0] = pipe[0];
        channel->pipe[1] = pipe[1];
      }
      else {
        psVar4 = (storage_type *)
                 QBasicUtf8StringView<false>::lengthHelperContainer<char,5ul>
                           ((char (*) [5])0x51e1cf);
        fnName_00.m_size = -1;
        fnName_00.m_data = psVar4;
        anon_unknown.dwarf_133c8f4::errorMessageForSyscall
                  ((QString *)&local_68,(anon_unknown_dwarf_133c8f4 *)0x51e1cf,fnName_00,in_R8D);
        setErrorAndEmit(this,FailedToStart,(QString *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      }
    }
    goto LAB_003d27d5;
  }
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_68,&channel->file);
  if (&this->stdinChannel == channel) {
    channel->pipe[1] = -1;
    pcVar5 = (char *)local_68.ptr;
    if (local_68.ptr == (char16_t *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    iVar3 = qt_safe_open(pcVar5,0,0x1ff);
    channel->pipe[0] = iVar3;
    bVar7 = true;
    if (iVar3 == -1) {
      QProcess::tr((QString *)pipe,"Could not open input redirection for reading",(char *)0x0,-1);
      setErrorAndEmit(this,FailedToStart,(QString *)pipe);
      goto LAB_003d27bf;
    }
  }
  else {
    channel->pipe[0] = -1;
    pcVar5 = (char *)local_68.ptr;
    if (local_68.ptr == (char16_t *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    iVar3 = qt_safe_open(pcVar5,(uint)channel->append * 0x200 + 0x241,0x1b6);
    channel->pipe[1] = iVar3;
    bVar7 = true;
    if (iVar3 == -1) {
      QProcess::tr((QString *)pipe,"Could not open input redirection for reading",(char *)0x0,-1);
      setErrorAndEmit(this,FailedToStart,(QString *)pipe);
LAB_003d27bf:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pipe);
      bVar7 = false;
    }
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
LAB_003d27d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannel(Channel &channel)
{
    Q_Q(QProcess);

    if (channel.type == Channel::Normal) {
        // we're piping this channel to our own process
        if (qt_create_pipe(channel.pipe) != 0) {
            setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
            return false;
        }

        // create the socket notifiers
        if (threadData.loadRelaxed()->hasEventDispatcher()) {
            if (&channel == &stdinChannel) {
                channel.notifier = new QSocketNotifier(QSocketNotifier::Write, q);
                channel.notifier->setSocket(channel.pipe[1]);
                QObject::connect(channel.notifier, SIGNAL(activated(QSocketDescriptor)),
                                 q, SLOT(_q_canWrite()));
            } else {
                channel.notifier = new QSocketNotifier(QSocketNotifier::Read, q);
                channel.notifier->setSocket(channel.pipe[0]);
                const char *receiver;
                if (&channel == &stdoutChannel)
                    receiver = SLOT(_q_canReadStandardOutput());
                else
                    receiver = SLOT(_q_canReadStandardError());
                QObject::connect(channel.notifier, SIGNAL(activated(QSocketDescriptor)),
                                 q, receiver);
            }
        }

        return true;
    } else if (channel.type == Channel::Redirect) {
        // we're redirecting the channel to/from a file
        QByteArray fname = QFile::encodeName(channel.file);

        if (&channel == &stdinChannel) {
            // try to open in read-only mode
            channel.pipe[1] = -1;
            if ( (channel.pipe[0] = qt_safe_open(fname, O_RDONLY)) != -1)
                return true;    // success
            setErrorAndEmit(QProcess::FailedToStart,
                            QProcess::tr("Could not open input redirection for reading"));
        } else {
            int mode = O_WRONLY | O_CREAT;
            if (channel.append)
                mode |= O_APPEND;
            else
                mode |= O_TRUNC;

            channel.pipe[0] = -1;
            if ( (channel.pipe[1] = qt_safe_open(fname, mode, 0666)) != -1)
                return true; // success

            setErrorAndEmit(QProcess::FailedToStart,
                            QProcess::tr("Could not open input redirection for reading"));
        }
        return false;
    } else {
        Q_ASSERT_X(channel.process, "QProcess::start", "Internal error");

        Channel *source;
        Channel *sink;

        if (channel.type == Channel::PipeSource) {
            // we are the source
            source = &channel;
            sink = &channel.process->stdinChannel;

            Q_ASSERT(source == &stdoutChannel);
            Q_ASSERT(sink->process == this && sink->type == Channel::PipeSink);
        } else {
            // we are the sink;
            source = &channel.process->stdoutChannel;
            sink = &channel;

            Q_ASSERT(sink == &stdinChannel);
            Q_ASSERT(source->process == this && source->type == Channel::PipeSource);
        }

        if (source->pipe[1] != INVALID_Q_PIPE || sink->pipe[0] != INVALID_Q_PIPE) {
            // already created, do nothing
            return true;
        } else {
            Q_ASSERT(source->pipe[0] == INVALID_Q_PIPE && source->pipe[1] == INVALID_Q_PIPE);
            Q_ASSERT(sink->pipe[0] == INVALID_Q_PIPE && sink->pipe[1] == INVALID_Q_PIPE);

            Q_PIPE pipe[2] = { -1, -1 };
            if (qt_create_pipe(pipe) != 0) {
                setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
                return false;
            }
            sink->pipe[0] = pipe[0];
            source->pipe[1] = pipe[1];

            return true;
        }
    }
}